

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void cmDocumentation::WarnFormFromFilename(RequestedHelpItem *request,bool *result)

{
  int iVar1;
  char *m1;
  string ext;
  string local_58;
  string local_38;
  
  cmsys::SystemTools::GetFilenameLastExtension(&local_58,&request->Filename);
  cmsys::SystemTools::UpperCase(&local_38,&local_58);
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_58);
  m1 = "Warning: HTML help format no longer supported";
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar1 == 0) {
        m1 = "Warning: Docbook help format no longer supported";
      }
      else {
        if ((local_58._M_string_length != 2) || (8 < (byte)(local_58._M_dataplus._M_p[1] - 0x31U)))
        goto LAB_002efca2;
        m1 = "Warning: Man help format no longer supported";
      }
    }
  }
  request->HelpType = None;
  *result = true;
  cmSystemTools::Message(m1,(char *)0x0);
LAB_002efca2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDocumentation::WarnFormFromFilename(
  cmDocumentation::RequestedHelpItem& request, bool& result)
{
  std::string ext = cmSystemTools::GetFilenameLastExtension(request.Filename);
  ext = cmSystemTools::UpperCase(ext);
  if ((ext == ".HTM") || (ext == ".HTML"))
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: HTML help format no longer supported");
    }
  else if (ext == ".DOCBOOK")
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Docbook help format no longer supported");
    }
  // ".1" to ".9" should be manpages
  else if ((ext.length()==2) && (ext[1] >='1') && (ext[1]<='9'))
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Man help format no longer supported");
    }
}